

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridDataType0.cpp
# Opt level: O1

void __thiscall
KDIS::DATA_TYPE::GridDataType0::SetDataValues(GridDataType0 *this,KUINT8 *Data,KUINT16 NumBytes)

{
  pointer *ppuVar1;
  pointer puVar2;
  iterator __position;
  ulong uVar3;
  
  puVar2 = (this->m_vui8DataVals).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->m_vui8DataVals).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish != puVar2) {
    (this->m_vui8DataVals).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
    .super__Vector_impl_data._M_finish = puVar2;
  }
  *(KUINT16 *)&(this->super_GridData).field_0xc = NumBytes;
  if (NumBytes != 0) {
    uVar3 = 0;
    do {
      __position._M_current =
           (this->m_vui8DataVals).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->m_vui8DataVals).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_realloc_insert<unsigned_char_const&>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&this->m_vui8DataVals,
                   __position,Data + uVar3);
      }
      else {
        *__position._M_current = Data[uVar3];
        ppuVar1 = &(this->m_vui8DataVals).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppuVar1 = *ppuVar1 + 1;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < *(ushort *)&(this->super_GridData).field_0xc);
  }
  return;
}

Assistant:

void GridDataType0::SetDataValues( KUINT8 * Data, KUINT16 NumBytes )
{
    m_vui8DataVals.clear();
    m_ui16NumBytes = NumBytes;
    for( KUINT16 i = 0; i < m_ui16NumBytes; ++i )
    {
        m_vui8DataVals.push_back( Data[i] );
    }
}